

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict copy_node(c2m_ctx_t c2m_ctx,node_t_conflict n)

{
  size_t sVar1;
  node_t_conflict n_00;
  pos_t pos;
  
  pos = get_node_pos(c2m_ctx,n);
  n_00 = new_node(c2m_ctx,n->code);
  set_node_pos(c2m_ctx,n_00,pos);
  sVar1 = (n->u).s.len;
  (n_00->u).s.s = (n->u).s.s;
  (n_00->u).s.len = sVar1;
  return n_00;
}

Assistant:

static node_t copy_node (c2m_ctx_t c2m_ctx, node_t n) {
  return copy_node_with_pos (c2m_ctx, n, POS (n));
}